

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_steal_queue.h
# Opt level: O2

task_run_handle __thiscall async::detail::work_steal_queue::steal(work_steal_queue *this)

{
  ulong uVar1;
  void *ptr;
  long *in_RSI;
  bool bVar2;
  
  do {
    uVar1 = in_RSI[1];
    if (in_RSI[2] == uVar1 || (long)(in_RSI[2] - uVar1) < 0) {
      (this->array)._M_b._M_p = (__pointer_type)0x0;
      return (task_run_handle)(task_ptr)this;
    }
    ptr = *(void **)(((long *)*in_RSI)[1] + (*(long *)*in_RSI - 1U & uVar1) * 8);
    LOCK();
    bVar2 = uVar1 == in_RSI[1];
    if (bVar2) {
      in_RSI[1] = uVar1 + 1;
    }
    UNLOCK();
  } while (!bVar2);
  task_run_handle::from_void_ptr((task_run_handle *)this,ptr);
  return (task_run_handle)(task_ptr)this;
}

Assistant:

task_run_handle steal()
	{
		// Loop while the compare_exchange fails. This is still lock-free because
		// a fail means that another thread has sucessfully stolen a task.
		while (true) {
			// Make sure top is read before bottom
			std::size_t t = top.load(std::memory_order_acquire);
			std::atomic_thread_fence(std::memory_order_seq_cst);
			std::size_t b = bottom.load(std::memory_order_acquire);

			// Exit if the queue is empty
			if (to_signed(b - t) <= 0)
				return task_run_handle();

			// Fetch the element from the queue
			circular_array* a = array.load(std::memory_order_consume);
			void* x = a->get(t);

			// Attempt to increment top
			if (top.compare_exchange_weak(t, t + 1, std::memory_order_seq_cst, std::memory_order_relaxed))
				return task_run_handle::from_void_ptr(x);
		}
	}